

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

string * __thiscall
Catch::AssertionResultData::reconstructExpression_abi_cxx11_
          (string *__return_storage_ptr__,AssertionResultData *this)

{
  pointer pcVar1;
  Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams> *pSVar2;
  size_t sVar3;
  size_type sVar4;
  ReusableStringStream rss;
  ReusableStringStream local_60;
  long *local_48 [2];
  long local_38 [2];
  
  sVar4 = (this->reconstructedExpression)._M_string_length;
  if (sVar4 == 0) {
    if ((this->lazyExpression).m_transientExpression == (ITransientExpression *)0x0) {
      sVar4 = 0;
    }
    else {
      local_60.super_NonCopyable._vptr_NonCopyable =
           (_func_int **)&PTR__ReusableStringStream_0023f428;
      pSVar2 = Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::
               getInternal();
      sVar3 = StringStreams::add(&pSVar2->super_StringStreams);
      local_60.m_index = sVar3;
      pSVar2 = Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::
               getInternal();
      local_60.m_oss =
           *(ostream **)
            &(pSVar2->super_StringStreams).m_streams.
             super__Vector_base<std::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[sVar3]._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ;
      operator<<(local_60.m_oss,&this->lazyExpression);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)&this->reconstructedExpression,(string *)local_48);
      if (local_48[0] != local_38) {
        operator_delete(local_48[0],local_38[0] + 1);
      }
      ReusableStringStream::~ReusableStringStream(&local_60);
      sVar4 = (this->reconstructedExpression)._M_string_length;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (this->reconstructedExpression)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)__return_storage_ptr__,pcVar1,pcVar1 + sVar4);
  return __return_storage_ptr__;
}

Assistant:

std::string AssertionResultData::reconstructExpression() const {

        if( reconstructedExpression.empty() ) {
            if( lazyExpression ) {
                ReusableStringStream rss;
                rss << lazyExpression;
                reconstructedExpression = rss.str();
            }
        }
        return reconstructedExpression;
    }